

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,wchar_t value,
          basic_format_specs<wchar_t> *specs,locale_ref loc)

{
  bool bVar1;
  undefined4 in_EAX;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar2;
  ulong uVar3;
  uint32_or_64_or_128_t<int> abs_value;
  undefined4 uStack_28;
  anon_class_4_1_a8c68091 local_24;
  
  uStack_28 = in_EAX;
  bVar1 = check_char_specs<wchar_t,fmt::v8::detail::error_handler>
                    (specs,(error_handler *)((long)&uStack_28 + 3));
  if (bVar1) {
    _uStack_28 = CONCAT44(value,uStack_28);
    bVar2 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_char<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::basic_format_specs<wchar_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                      (out,specs,1,1,&local_24);
  }
  else {
    if (value < L'\0') {
      value = -value;
      uVar3 = 0x100002d00000000;
    }
    else {
      uVar3 = (ulong)*(uint *)(&DAT_00196f70 + (*(ushort *)&specs->field_0x9 >> 2 & 0x1c)) << 0x20;
    }
    bVar2 = write_int_noinline<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>
                      (out,(write_int_arg<unsigned_int>)((uint)value | uVar3),specs,loc);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}